

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void fcse_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ArchCPU_conflict2 *cpu_00;
  uint64_t uVar1;
  ARMCPU_conflict1 *cpu;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  cpu_00 = env_archcpu(env);
  uVar1 = raw_read(env,ri);
  if (uVar1 != value) {
    tlb_flush_aarch64(&cpu_00->parent_obj);
    raw_write(env,ri,value);
  }
  return;
}

Assistant:

static void fcse_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);

    if (raw_read(env, ri) != value) {
        /* Unlike real hardware the qemu TLB uses virtual addresses,
         * not modified virtual addresses, so this causes a TLB flush.
         */
        tlb_flush(CPU(cpu));
        raw_write(env, ri, value);
    }
}